

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void __thiscall ObjectBlockPool<128,_512>::FinalizePending(ObjectBlockPool<128,_512> *this)

{
  SmallBlock<128> *marker_00;
  uint uVar1;
  SmallBlock<128> **ppSVar2;
  ExternTypeInfo *type;
  uint local_4c;
  uint count;
  uint arrayPadding;
  char *base;
  ExternTypeInfo *typeInfo;
  markerType *marker;
  MySmallBlock *block;
  uint e;
  uint i;
  ObjectBlockPool<128,_512> *this_local;
  
  block._4_4_ = 0;
  uVar1 = FastVector<SmallBlock<128>_*,_false,_false>::size(&this->objectsToFinalize);
  for (; block._4_4_ < uVar1; block._4_4_ = block._4_4_ + 1) {
    ppSVar2 = FastVector<SmallBlock<128>_*,_false,_false>::operator[]
                        (&this->objectsToFinalize,block._4_4_);
    marker_00 = *ppSVar2;
    marker_00->marker = NULLC::OBJECT_VISIBLE | marker_00->marker;
    type = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::linker + 0x200),
                      (uint)(marker_00->marker >> 8) & 0xffffff);
    if ((marker_00->marker & NULLC::OBJECT_ARRAY) == 0) {
      GC::CheckVariable(marker_00->data + 8,type);
    }
    else {
      if (type->defaultAlign < 5) {
        local_4c = 4;
      }
      else {
        local_4c = (uint)type->defaultAlign;
      }
      GC::CheckArrayElements
                (marker_00->data + (ulong)local_4c + 8,
                 *(uint *)((long)marker_00 + (ulong)local_4c + 4),type);
    }
    NULLC::FinalizeObject(&marker_00->marker,(char *)marker_00);
  }
  FastVector<SmallBlock<128>_*,_false,_false>::clear(&this->objectsToFinalize);
  return;
}

Assistant:

void FinalizePending()
	{
		for(unsigned i = 0, e = objectsToFinalize.size(); i < e; i++)
		{
			MySmallBlock *block = objectsToFinalize[i];

			markerType &marker = block->marker;

			// Mark block as used
			marker |= NULLC::OBJECT_VISIBLE;

			ExternTypeInfo &typeInfo = NULLC::linker->exTypes[(unsigned)marker >> 8];

			char *base = block->data;

			if(marker & NULLC::OBJECT_ARRAY)
			{
				unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

				unsigned count = *(unsigned*)(base + sizeof(markerType) + arrayPadding - 4);

				GC::CheckArrayElements(base + sizeof(markerType) + arrayPadding, count, typeInfo);
			}
			else
			{
				GC::CheckVariable(base + sizeof(markerType), typeInfo);
			}

			NULLC::FinalizeObject(marker, block->data);
		}

		objectsToFinalize.clear();
	}